

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

void __thiscall AddrManImpl::Delete(AddrManImpl *this,nid_type nId)

{
  size_type sVar1;
  mapped_type *pmVar2;
  key_type *__x;
  mapped_type *pmVar3;
  undefined8 in_RSI;
  long in_RDI;
  unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
  *this_00;
  long in_FS_OFFSET;
  AddrInfo *info;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int iVar4;
  key_type *in_stack_ffffffffffffffc0;
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  *in_stack_ffffffffffffffc8;
  AddrManImpl *this_01;
  
  this_01 = *(AddrManImpl **)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffbc,(AnnotatedMixin<std::mutex> *)0xee45c2);
  sVar1 = std::
          unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
          ::count(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (sVar1 == 0) {
    __assert_fail("mapInfo.count(nId) != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                  ,0x1cc,"void AddrManImpl::Delete(nid_type)");
  }
  pmVar2 = std::
           unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
           ::operator[](in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (((pmVar2->fInTried ^ 0xffU) & 1) == 0) {
    __assert_fail("!info.fInTried",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                  ,0x1ce,"void AddrManImpl::Delete(nid_type)");
  }
  if (pmVar2->nRefCount != 0) {
    __assert_fail("info.nRefCount == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                  ,0x1cf,"void AddrManImpl::Delete(nid_type)");
  }
  iVar4 = pmVar2->nRandomPos;
  this_00 = (unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
             *)(in_RDI + 0x158);
  std::vector<long,_std::allocator<long>_>::size
            ((vector<long,_std::allocator<long>_> *)CONCAT44(iVar4,in_stack_ffffffffffffffb8));
  SwapRandom(this_01,(uint)((ulong)in_RSI >> 0x20),(uint)in_RSI);
  __x = (key_type *)(in_RDI + 0xa01c8);
  CNetAddr::GetNetwork((CNetAddr *)__x);
  pmVar3 = std::
           unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
           ::operator[]((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                         *)this_00,(key_type *)__x);
  pmVar3->n_new = pmVar3->n_new - 1;
  std::vector<long,_std::allocator<long>_>::pop_back
            ((vector<long,_std::allocator<long>_> *)CONCAT44(iVar4,in_stack_ffffffffffffffb8));
  std::
  unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
  ::erase(this_00,__x);
  std::
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  ::erase((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
           *)this_00,(key_type *)__x);
  *(int *)(in_RDI + 0x20178) = *(int *)(in_RDI + 0x20178) + -1;
  if (*(AddrManImpl **)(in_FS_OFFSET + 0x28) == this_01) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::Delete(nid_type nId)
{
    AssertLockHeld(cs);

    assert(mapInfo.count(nId) != 0);
    AddrInfo& info = mapInfo[nId];
    assert(!info.fInTried);
    assert(info.nRefCount == 0);

    SwapRandom(info.nRandomPos, vRandom.size() - 1);
    m_network_counts[info.GetNetwork()].n_new--;
    vRandom.pop_back();
    mapAddr.erase(info);
    mapInfo.erase(nId);
    nNew--;
}